

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * google::CheckstrcasecmpfalseImpl_abi_cxx11_(char *s1,char *s2,char *names)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  undefined1 local_1a8 [8];
  ostringstream ss;
  bool equal;
  char *names_local;
  char *s2_local;
  char *s1_local;
  
  bVar3 = true;
  if (((s1 != s2) && (bVar3 = false, s1 != (char *)0x0)) && (bVar3 = false, s2 != (char *)0x0)) {
    iVar1 = strcasecmp(s1,s2);
    bVar3 = iVar1 == 0;
  }
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    s2_local = s1;
    if (s1 == (char *)0x0) {
      s2_local = "";
    }
    names_local = s2;
    if (s2 == (char *)0x0) {
      names_local = "";
    }
    poVar2 = std::operator<<((ostream *)local_1a8,"CHECK_STRCASENE failed: ");
    poVar2 = std::operator<<(poVar2,names);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = std::operator<<(poVar2,s2_local);
    poVar2 = std::operator<<(poVar2," vs. ");
    poVar2 = std::operator<<(poVar2,names_local);
    std::operator<<(poVar2,")");
    s1_local = (char *)operator_new(0x20);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  else {
    s1_local = (char *)0x0;
  }
  return (string *)s1_local;
}

Assistant:

int posix_strerror_r(int err, char *buf, size_t len) {
  // Sanity check input parameters
  if (buf == NULL || len <= 0) {
    errno = EINVAL;
    return -1;
  }

  // Reset buf and errno, and try calling whatever version of strerror_r()
  // is implemented by glibc
  buf[0] = '\000';
  int old_errno = errno;
  errno = 0;
  char *rc = reinterpret_cast<char *>(strerror_r(err, buf, len));

  // Both versions set errno on failure
  if (errno) {
    // Should already be there, but better safe than sorry
    buf[0]     = '\000';
    return -1;
  }
  errno = old_errno;

  // POSIX is vague about whether the string will be terminated, although
  // is indirectly implies that typically ERANGE will be returned, instead
  // of truncating the string. This is different from the GNU implementation.
  // We play it safe by always terminating the string explicitly.
  buf[len-1] = '\000';

  // If the function succeeded, we can use its exit code to determine the
  // semantics implemented by glibc
  if (!rc) {
    return 0;
  } else {
    // GNU semantics detected
    if (rc == buf) {
      return 0;
    } else {
      buf[0] = '\000';
#if defined(OS_MACOSX) || defined(OS_FREEBSD) || defined(OS_OPENBSD)
      if (reinterpret_cast<intptr_t>(rc) < sys_nerr) {
        // This means an error on MacOSX or FreeBSD.
        return -1;
      }
#endif
      strncat(buf, rc, len-1);
      return 0;
    }
  }
}